

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O2

void __thiscall
HBLAS3::
hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,std::complex<double>,(char)67,(char)67,100ul,100ul,100ul>
          (HBLAS3 *this)

{
  double dVar1;
  complex<double> ALPHA;
  complex<double> BETA_00;
  pointer pqVar2;
  quaternion<double> *x_3;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  pointer pqVar6;
  ulong uVar7;
  quaternion<double> *x;
  pointer pqVar8;
  _Alloc_hider in_XMM0_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  complex<double> ALPHA_00;
  undefined8 uVar14;
  quaternion<double> *Y;
  undefined4 in_stack_fffffffffffffcd8;
  int32_t INCY;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 uVar15;
  string AFstr;
  ulong local_2f0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> B;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> C;
  complex<double> BETA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  undefined1 local_290 [8];
  undefined8 local_288;
  shared_count sStack_280;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> SCR;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> CC;
  value_type tstVal;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined8 *local_1e8;
  char *local_1e0;
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined ***local_1c8;
  ulong *local_1c0;
  undefined **local_1b8;
  undefined1 local_1b0;
  undefined ***local_1a8;
  char *local_1a0;
  undefined **local_198;
  undefined1 local_190;
  undefined ***local_188;
  undefined1 *local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined ***local_168;
  char *local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined ***local_148;
  value_type *local_140;
  undefined **local_138;
  undefined1 local_130;
  undefined ***local_128;
  char *local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined ***local_108;
  quaternion<double> *local_100;
  quaternion<double> local_f8;
  quaternion<double> __r;
  string BetaFstr;
  string AlphaFstr;
  string BFstr;
  quaternion<double> local_50;
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&AFstr);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&B,10000,(allocator_type *)&AFstr);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&C,10000,(allocator_type *)&AFstr);
  for (pqVar6 = A.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pqVar2 = B.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pqVar8 = B.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pqVar6 != A.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
    genRandom<HAXX::quaternion<double>>();
    pqVar6->_M_real = (double)AFstr._M_dataplus._M_p;
    pqVar6->_M_imag_i =
         (double)CONCAT44(AFstr._M_string_length._4_4_,(int32_t)AFstr._M_string_length);
    pqVar6->_M_imag_j = (double)AFstr.field_2._M_allocated_capacity;
    pqVar6->_M_imag_k = (double)AFstr.field_2._8_8_;
    in_XMM0_Qa = AFstr._M_dataplus;
  }
  for (; pqVar6 = C.
                  super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, pqVar8 != pqVar2; pqVar8 = pqVar8 + 1)
  {
    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
    genRandom<HAXX::quaternion<double>>();
    pqVar8->_M_real = (double)AFstr._M_dataplus._M_p;
    pqVar8->_M_imag_i =
         (double)CONCAT44(AFstr._M_string_length._4_4_,(int32_t)AFstr._M_string_length);
    pqVar8->_M_imag_j = (double)AFstr.field_2._M_allocated_capacity;
    pqVar8->_M_imag_k = (double)AFstr.field_2._8_8_;
    in_XMM0_Qa = AFstr._M_dataplus;
  }
  for (; pqVar6 != C.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
    genRandom<HAXX::quaternion<double>>();
    pqVar6->_M_real = (double)AFstr._M_dataplus._M_p;
    pqVar6->_M_imag_i =
         (double)CONCAT44(AFstr._M_string_length._4_4_,(int32_t)AFstr._M_string_length);
    pqVar6->_M_imag_j = (double)AFstr.field_2._M_allocated_capacity;
    pqVar6->_M_imag_k = (double)AFstr.field_2._8_8_;
    in_XMM0_Qa = AFstr._M_dataplus;
  }
  uVar14 = in_ZMM1._0_8_;
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&CC,&C);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&SCR,100,(allocator_type *)&AFstr);
  genRandom<std::complex<double>>();
  genRandom<std::complex<double>>();
  BETA._M_value._8_8_ = uVar14;
  t_str<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<std::complex<double>>();
  t_str<std::complex<double>>();
  std::operator<<((ostream *)&std::cout,"\n HBLAS GEMM TEST: \n");
  std::operator<<((ostream *)&std::cout,"   - _F =      DOUBLE    \n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   - _AF =     ");
  poVar3 = std::operator<<(poVar3,(string *)&AFstr);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   - _BF =     ");
  poVar3 = std::operator<<(poVar3,(string *)&BFstr);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   - _AlphaF = ");
  poVar3 = std::operator<<(poVar3,(string *)&AlphaFstr);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   - _BetaF =  ");
  poVar3 = std::operator<<(poVar3,(string *)&BetaFstr);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   - _TA =     ");
  poVar3 = std::operator<<(poVar3,'C');
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"   - _TB =     ");
  poVar3 = std::operator<<(poVar3,'C');
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cout,"\n   PROBLEM DIMENSIONS\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"     - N =     ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"     - M =     ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"     - K =     ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"     - LDA =   ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"     - LDB =   ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"     - LDC =   ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  uVar14 = 0x18f8ac;
  lVar4 = std::chrono::_V2::system_clock::now();
  ALPHA._M_value._8_8_ =
       B.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ALPHA._M_value._0_8_ = 100;
  BETA_00._M_value._8_4_ = in_stack_fffffffffffffcd8;
  BETA_00._M_value._0_8_ = uVar14;
  BETA_00._M_value._12_4_ = in_stack_fffffffffffffcdc;
  HAXX::
  HBLAS_GEMM<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,std::complex<double>>
            ('C','C',100,100,100,ALPHA,
             A.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,
             C.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,BETA_00,
             (quaternion<double> *)AFstr._M_dataplus._M_p,(int32_t)AFstr._M_string_length);
  lVar5 = std::chrono::_V2::system_clock::now();
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar3," * GEMM took ");
  poVar3 = std::ostream::_M_insert<double>((double)(lVar5 - lVar4) / 1000000000.0);
  Y = (quaternion<double> *)0x18f93e;
  std::operator<<(poVar3," s\n\n");
  for (pqVar6 = B.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pqVar6 != B.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    auVar10._0_8_ = -pqVar6->_M_imag_k;
    auVar10._8_8_ = 0x8000000000000000;
    pqVar6->_M_imag_i = -pqVar6->_M_imag_i;
    pqVar6->_M_imag_j = -pqVar6->_M_imag_j;
    dVar1 = (double)vmovlpd_avx(auVar10);
    pqVar6->_M_imag_k = dVar1;
  }
  uVar7 = 0;
  while( true ) {
    INCY = (int32_t)uVar7;
    uVar15 = (undefined4)(uVar7 >> 0x20);
    if (99 < uVar7) break;
    ALPHA_00._M_value._8_8_ = 100;
    ALPHA_00._M_value._0_8_ =
         A.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    HAXX::
    HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
              ('C',100,100,ALPHA_00,
               B.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar7,100,
               SCR.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1,(double)in_XMM0_Qa._M_p,Y,INCY);
    uVar7 = 0;
    while (pqVar6 = SCR.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, local_2f0 = uVar7, uVar7 < 100) {
      lVar4 = CONCAT44(uVar15,INCY) * 100 + uVar7;
      HAXX::operator*(&BETA,CC.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar4);
      pqVar6 = pqVar6 + uVar7;
      __r._M_real = tstVal._M_real + pqVar6->_M_real;
      __r._M_imag_i = tstVal._M_imag_i + pqVar6->_M_imag_i;
      __r._M_imag_j = tstVal._M_imag_j + pqVar6->_M_imag_j;
      __r._M_imag_k = tstVal._M_imag_k + pqVar6->_M_imag_k;
      pqVar6 = C.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar4;
      tstVal._M_real = pqVar6->_M_real;
      tstVal._M_imag_i = pqVar6->_M_imag_i;
      tstVal._M_imag_j = pqVar6->_M_imag_j;
      tstVal._M_imag_k = pqVar6->_M_imag_k;
      local_240 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
      local_238 = "";
      local_250 = &boost::unit_test::basic_cstring<char_const>::null;
      local_248 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x88);
      HAXX::inv<double>(&local_50,&tstVal);
      HAXX::operator*(&local_f8,&__r,&local_50);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_f8._M_imag_i;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_f8._M_imag_j;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_f8._M_imag_k;
      local_260 = 
      "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
      local_258 = "";
      auVar13._8_8_ = 0;
      auVar13._0_8_ = (local_f8._M_real + -1.0) * (local_f8._M_real + -1.0);
      auVar10 = vfmadd231sd_fma(auVar13,auVar9,auVar9);
      auVar10 = vfmadd231sd_fma(auVar10,auVar11,auVar11);
      auVar10 = vfmadd231sd_fma(auVar10,auVar12,auVar12);
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      local_290[0] = auVar10._0_8_ < 1e-12;
      local_288 = 0;
      sStack_280.pi_ = (sp_counted_base *)0x0;
      local_1f0 = 0;
      local_1d0 = 0;
      local_1b0 = 0;
      local_190 = 0;
      local_170 = 0;
      local_150 = 0;
      local_130 = 0;
      local_110 = 0;
      local_1f8 = &PTR__lazy_ostream_00219c88;
      local_1e8 = &boost::unit_test::lazy_ostream::inst;
      local_1e0 = "\n i = ";
      local_1d8 = &PTR__lazy_ostream_00219c48;
      local_1c8 = &local_1f8;
      local_1c0 = &local_2f0;
      local_1b8 = &PTR__lazy_ostream_00219c08;
      local_1a8 = &local_1d8;
      local_1a0 = " j = ";
      local_198 = &PTR__lazy_ostream_00219bc8;
      local_188 = &local_1b8;
      local_178 = &PTR__lazy_ostream_00219b88;
      local_168 = &local_198;
      local_160 = ", HBLAS_GEMM = ";
      local_158 = &PTR__lazy_ostream_00219b48;
      local_148 = &local_178;
      local_140 = &tstVal;
      local_138 = &PTR__lazy_ostream_00219b08;
      local_128 = &local_158;
      local_120 = ", REFERENCE = ";
      local_118 = &PTR__lazy_ostream_00219ac8;
      local_108 = &local_138;
      local_180 = &stack0xfffffffffffffcd8;
      local_100 = &__r;
      boost::test_tools::tt_detail::report_assertion(local_290,&local_118,&local_260,0x88,1,1,0);
      Y = (quaternion<double> *)0x18fd32;
      boost::detail::shared_count::~shared_count(&sStack_280);
      uVar7 = local_2f0 + 1;
    }
    uVar7 = CONCAT44(uVar15,INCY) + 1;
  }
  std::__cxx11::string::~string((string *)&BetaFstr);
  std::__cxx11::string::~string((string *)&AlphaFstr);
  std::__cxx11::string::~string((string *)&BFstr);
  std::__cxx11::string::~string((string *)&AFstr);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&SCR.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&CC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&C.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&B.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas3_gemm() {

  size_t NK = N*K;
  size_t KM = K*M;
  size_t NM = N*M;

  size_t LDA = ( _TA == 'N' ) ? N : K;
  size_t LDB = ( _TB == 'N' ) ? K : M;
  size_t LDC = N;

  // Random Quaternion vectors and matricies
  std::vector<_AF> A(NK);
  std::vector<_BF> B(KM);
  std::vector<qd>  C(NM);

  for(auto &x : A) x = genRandom<_AF>();
  for(auto &x : B) x = genRandom<_BF>();
  for(auto &x : C) x = genRandom<qd> ();

  std::vector<qd> CC(C);
  std::vector<qd> SCR(N);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA  = genRandom<_BetaF>();


  std::string AFstr     = t_str<_AF>(); 
  std::string BFstr     = t_str<_BF>(); 
  std::string AlphaFstr = t_str<_AlphaF>(); 
  std::string BetaFstr  = t_str<_BetaF>(); 
                
                


  std::cout << "\n HBLAS GEMM TEST: \n";
  std::cout << "   - _F =      DOUBLE    \n";
  std::cout << "   - _AF =     " << AFstr << "\n";
  std::cout << "   - _BF =     " << BFstr << "\n";
  std::cout << "   - _AlphaF = " << AlphaFstr << "\n";
  std::cout << "   - _BetaF =  " << BetaFstr << "\n";
  std::cout << "   - _TA =     " << _TA << "\n";
  std::cout << "   - _TB =     " << _TB << "\n";

  std::cout << "\n   PROBLEM DIMENSIONS\n";
  std::cout << "     - N =     " << N << "\n";
  std::cout << "     - M =     " << M << "\n";
  std::cout << "     - K =     " << K << "\n";
  std::cout << "     - LDA =   " << LDA << "\n";
  std::cout << "     - LDB =   " << LDB << "\n";
  std::cout << "     - LDC =   " << LDC << "\n";



  std::cout << "\n";



  auto gemmStart = std::chrono::high_resolution_clock::now();

  HBLAS_GEMM(_TA, _TB, N, M, K, ALPHA, &A[0], LDA, &B[0], LDB, BETA, 
    &C[0], LDC);

  auto gemmEnd = std::chrono::high_resolution_clock::now();

  std::chrono::duration<double> gemmDur = gemmEnd - gemmStart;
  std::cout << std::endl << " * GEMM took " << gemmDur.count() 
    << " s\n\n";


  HAXX_INT BStride = 1;
  if( _TB != 'N' ) BStride = LDB;
  if( _TB == 'C' ) 
    for(auto &x : B) x = HAXX::conj(x); 

  for(size_t j = 0; j < M; j++) {

    HAXX_INT BStart = j;
    if( _TB == 'N' ) BStart *= LDB;

    HBLAS_GEMV(_TA, N, K, ALPHA, &A[0], LDA, &B[BStart], BStride, 0., 
      &SCR[0], 1);

    for(size_t i = 0; i < N; i++) {

      size_t indx = RANK2_INDX(i,j,LDC);
      auto refVal = SCR[i] + BETA*CC[indx];
      auto tstVal = C[indx];

      BOOST_CHECK_MESSAGE( 
        CMP_Q( refVal, tstVal ),
        "\n i = " << i << 
          " j = " << j << 
          ", HBLAS_GEMM = " << tstVal << 
          ", REFERENCE = "  << refVal 
      );
    }
  }

}